

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O3

void cCompRow_to_CompCol(int m,int n,int_t nnz,singlecomplex *a,int_t *colind,int_t *rowptr,
                        singlecomplex **at,int_t **rowind,int_t **colptr)

{
  int iVar1;
  int_t *piVar2;
  singlecomplex *psVar3;
  int_t *piVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  psVar3 = singlecomplexMalloc((long)nnz);
  *at = psVar3;
  piVar4 = intMalloc(nnz);
  *rowind = piVar4;
  piVar4 = intMalloc(n + 1);
  *colptr = piVar4;
  piVar4 = intCalloc(n);
  if (0 < m) {
    iVar7 = *rowptr;
    uVar5 = 0;
    do {
      lVar8 = uVar5 + 1;
      uVar5 = uVar5 + 1;
      iVar1 = rowptr[lVar8];
      if (iVar7 < rowptr[lVar8]) {
        lVar8 = (long)iVar7;
        do {
          piVar4[colind[lVar8]] = piVar4[colind[lVar8]] + 1;
          lVar8 = lVar8 + 1;
          iVar1 = rowptr[uVar5];
        } while (lVar8 < rowptr[uVar5]);
      }
      iVar7 = iVar1;
    } while (uVar5 != (uint)m);
  }
  piVar2 = *colptr;
  *piVar2 = 0;
  if (0 < n) {
    uVar5 = 0;
    do {
      piVar2[uVar5 + 1] = piVar4[uVar5] + piVar2[uVar5];
      piVar4[uVar5] = piVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  if (0 < m) {
    iVar7 = *rowptr;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      iVar1 = rowptr[uVar5 + 1];
      if (iVar7 < rowptr[uVar5 + 1]) {
        lVar8 = (long)iVar7;
        do {
          iVar7 = colind[lVar8];
          iVar1 = piVar4[iVar7];
          (*rowind)[iVar1] = (int_t)uVar5;
          (*at)[iVar1] = a[lVar8];
          piVar4[iVar7] = piVar4[iVar7] + 1;
          lVar8 = lVar8 + 1;
          iVar1 = rowptr[uVar6];
        } while (lVar8 < rowptr[uVar6]);
      }
      iVar7 = iVar1;
      uVar5 = uVar6;
    } while (uVar6 != (uint)m);
  }
  superlu_free(piVar4);
  return;
}

Assistant:

void
cCompRow_to_CompCol(int m, int n, int_t nnz, 
		    singlecomplex *a, int_t *colind, int_t *rowptr,
		    singlecomplex **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (singlecomplex *) singlecomplexMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}